

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryRace(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_32_4_1aa1e5b7 handler;
  RecyclableObject *exceptionObject;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  JavascriptLibrary *this_00;
  Var pvVar6;
  JavascriptException *err;
  RecyclableObject *local_d0;
  RecyclableObject *resolveFunc;
  Var resolveVar;
  RecyclableObject *iterator;
  JavascriptExceptionObject *exception;
  RecyclableObject *constructorObject;
  JavascriptPromiseCapability *promiseCapability;
  Var iterable;
  Var undefinedVar;
  Var local_80;
  Var constructor;
  undefined1 local_70 [8];
  AutoTagNativeLibraryEntry __tag;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x292,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x293,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  __tag.entry.next = (Entry *)RecyclableObject::GetScriptContext(function);
  constructor = function_local;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_70,function,(CallInfo)function_local,L"Promise.race"
             ,&stack0x00000000);
  local_80 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar3 = Js::JavascriptOperators::IsObject(local_80);
  if (BVar3 != 0) {
    this_00 = ScriptContext::GetLibrary((ScriptContext *)__tag.entry.next);
    promiseCapability =
         (JavascriptPromiseCapability *)
         JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    iterable = promiseCapability;
    if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
      promiseCapability =
           (JavascriptPromiseCapability *)Arguments::operator[]((Arguments *)&scriptContext,1);
    }
    constructorObject =
         (RecyclableObject *)NewPromiseCapability(local_80,(ScriptContext *)__tag.entry.next);
    exception = (JavascriptExceptionObject *)VarTo<Js::RecyclableObject>(local_80);
    iterator = (RecyclableObject *)0x0;
    resolveVar = Js::JavascriptOperators::GetIterator
                           (promiseCapability,(ScriptContext *)__tag.entry.next,false);
    resolveFunc = (RecyclableObject *)
                  Js::JavascriptOperators::GetProperty
                            ((RecyclableObject *)exception,0x134,(ScriptContext *)__tag.entry.next,
                             (PropertyValueInfo *)0x0);
    bVar2 = JavascriptConversion::IsCallable(resolveFunc);
    if (bVar2) {
      local_d0 = VarTo<Js::RecyclableObject>(resolveFunc);
      handler.resolveFunc = &local_d0;
      handler.scriptContext = (ScriptContext **)&__tag.entry.next;
      handler.constructorObject = (RecyclableObject **)&exception;
      handler.promiseCapability = (JavascriptPromiseCapability **)&constructorObject;
      Js::JavascriptOperators::
      DoIteratorStepAndValue<Js::JavascriptPromise::EntryRace(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                ((RecyclableObject *)resolveVar,(ScriptContext *)__tag.entry.next,handler);
      exceptionObject = iterator;
      if (iterator != (RecyclableObject *)0x0) {
        pvVar6 = JavascriptPromiseCapability::GetReject
                           ((JavascriptPromiseCapability *)constructorObject);
        TryRejectWithExceptionObject
                  ((JavascriptExceptionObject *)exceptionObject,pvVar6,
                   (ScriptContext *)__tag.entry.next);
      }
      pvVar6 = JavascriptPromiseCapability::GetPromise
                         ((JavascriptPromiseCapability *)constructorObject);
      AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_70);
      return pvVar6;
    }
    JavascriptError::ThrowTypeError((ScriptContext *)__tag.entry.next,-0x7ff5ec76,(PCWSTR)0x0);
  }
  JavascriptError::ThrowTypeError((ScriptContext *)__tag.entry.next,-0x7ff5ec41,L"Promise.race");
}

Assistant:

Var JavascriptPromise::EntryRace(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Promise.race"));

        // 1. Let C be the this value.
        Var constructor = args[0];

        // 2. If Type(C) is not Object, throw a TypeError exception.
        if (!JavascriptOperators::IsObject(constructor))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Promise.race"));
        }

        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();
        Var iterable;

        if (args.Info.Count > 1)
        {
            iterable = args[1];
        }
        else
        {
            iterable = undefinedVar;
        }

        // 3. Let promiseCapability be NewPromiseCapability(C).
        JavascriptPromiseCapability* promiseCapability = NewPromiseCapability(constructor, scriptContext);

        // We know that constructor is an object at this point - further, we even know that it is a constructor - because NewPromiseCapability
        // would throw otherwise. That means we can safely cast constructor into a RecyclableObject* now and avoid having to perform ToObject
        // as part of the Invoke operation performed inside the loop below.
        RecyclableObject* constructorObject = VarTo<RecyclableObject>(constructor);
        JavascriptExceptionObject* exception = nullptr;

        try
        {
            // 4. Let iterator be GetIterator(iterable).
            RecyclableObject* iterator = JavascriptOperators::GetIterator(iterable, scriptContext);

            Var resolveVar = JavascriptOperators::GetProperty(constructorObject, Js::PropertyIds::resolve, scriptContext);
            if (!JavascriptConversion::IsCallable(resolveVar))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
            }

            RecyclableObject* resolveFunc = VarTo<RecyclableObject>(resolveVar);

            JavascriptOperators::DoIteratorStepAndValue(iterator, scriptContext, [&](Var next)
            {
                ThreadContext * threadContext = scriptContext->GetThreadContext();
                Var nextPromise = nullptr;
                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    nextPromise = CALL_FUNCTION(threadContext,
                                    resolveFunc, Js::CallInfo(CallFlags_Value, 2),
                                    constructorObject,
                                    next);
                }
                END_SAFE_REENTRANT_CALL

                RecyclableObject* nextPromiseObject;

                if (!JavascriptConversion::ToObject(nextPromise, scriptContext, &nextPromiseObject))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedObject);
                }

                Var thenVar = JavascriptOperators::GetProperty(nextPromiseObject, Js::PropertyIds::then, scriptContext);

                if (!JavascriptConversion::IsCallable(thenVar))
                {
                    JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction);
                }

                RecyclableObject* thenFunc = VarTo<RecyclableObject>(thenVar);

                BEGIN_SAFE_REENTRANT_CALL(threadContext)
                {
                    CALL_FUNCTION(threadContext,
                        thenFunc, Js::CallInfo(CallFlags_Value, 3),
                        nextPromiseObject,
                        promiseCapability->GetResolve(),
                        promiseCapability->GetReject());
                }
                END_SAFE_REENTRANT_CALL

            });
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        return promiseCapability->GetPromise();
    }